

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O1

void __thiscall FDDSTexture::MakeTexture(FDDSTexture *this)

{
  uint uVar1;
  BYTE *pBVar2;
  FWadLump lump;
  FWadLump local_40;
  
  FWadCollection::OpenLumpNum(&local_40,&Wads,(this->super_FTexture).SourceLump);
  pBVar2 = (BYTE *)operator_new__((ulong)(this->super_FTexture).Height *
                                  (ulong)(this->super_FTexture).Width);
  this->Pixels = pBVar2;
  FWadLump::Seek(&local_40,0x80,0);
  if (this->Format - 1 < 4) {
    ReadRGB(this,&local_40,(BYTE *)0x0);
  }
  else {
    uVar1 = this->Format + 0xceaba7bc;
    uVar1 = uVar1 * 0x100 | uVar1 >> 0x18;
    if (uVar1 - 1 < 2) {
      DecompressDXT3(this,&local_40,false,(BYTE *)0x0);
    }
    else if (uVar1 - 3 < 2) {
      DecompressDXT5(this,&local_40,false,(BYTE *)0x0);
    }
    else if (uVar1 == 0) {
      DecompressDXT1(this,&local_40,(BYTE *)0x0);
    }
  }
  FWadLump::~FWadLump(&local_40);
  return;
}

Assistant:

void FDDSTexture::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);

	Pixels = new BYTE[Width*Height];

	lump.Seek (sizeof(DDSURFACEDESC2) + 4, SEEK_SET);

	if (Format >= 1 && Format <= 4)		// RGB: Format is # of bytes per pixel
	{
		ReadRGB (lump);
	}
	else if (Format == ID_DXT1)
	{
		DecompressDXT1 (lump);
	}
	else if (Format == ID_DXT3 || Format == ID_DXT2)
	{
		DecompressDXT3 (lump, Format == ID_DXT2);
	}
	else if (Format == ID_DXT5 || Format == ID_DXT4)
	{
		DecompressDXT5 (lump, Format == ID_DXT4);
	}
}